

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall TrodesConfig::TrodesConfig(TrodesConfig *this,TrodesConfig *obj)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  TrodesConfig *dst;
  vector<NDevice,_std::allocator<NDevice>_> local_58;
  vector<NDevice,_std::allocator<NDevice>_> local_38;
  
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__TrodesConfig_002e75e0;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dst = obj;
  clear(this);
  iVar1 = copy(obj,(EVP_PKEY_CTX *)dst,src);
  std::vector<NDevice,_std::allocator<NDevice>_>::vector
            (&local_58,
             (vector<NDevice,_std::allocator<NDevice>_> *)(CONCAT44(extraout_var,iVar1) + 8));
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_38);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&local_58);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_58,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(CONCAT44(extraout_var,iVar1) + 0x20))
  ;
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_38);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&local_58);
  return;
}

Assistant:

TrodesConfig::TrodesConfig(const TrodesConfig &obj) {
    clear();
//    std::cerr << "COPYING [" << &obj << "] into this [" << this << "]\n";

    TrodesConfig *objCpy = obj.copy(); //create a new memory copy of the target TrodesConfig object and assign it to self
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
}